

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall
bssl::ssl_decode_client_hello_inner
          (bssl *this,SSL *ssl,uint8_t *out_alert,Array<unsigned_char> *out_client_hello_inner,
          Span<const_unsigned_char> encoded_client_hello_inner,SSL_CLIENT_HELLO *client_hello_outer)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  cbb_st *pcVar5;
  uchar *puVar6;
  size_t sVar7;
  uint8_t *puVar8;
  uchar *puVar9;
  Span<const_unsigned_char> body_00;
  Span<const_unsigned_char> SVar10;
  Span<const_unsigned_char> local_218;
  undefined1 local_208 [8];
  CBS ext_body;
  undefined1 local_1f0 [4];
  uint16_t found;
  uint16_t want;
  CBS outer_extensions;
  CBS ext_list;
  Span<const_unsigned_char> inner_extensions_after;
  Span<const_unsigned_char> inner_extensions_before;
  size_t offset;
  CBS ext_list_wrapper;
  Span<const_unsigned_char> inner_extensions;
  undefined1 local_178 [8];
  CBB extensions_cbb;
  CBB body;
  ScopedCBB cbb;
  uint8_t padding;
  undefined1 local_d0 [8];
  CBS cbs;
  SSL_CLIENT_HELLO client_hello_inner;
  SSL_CLIENT_HELLO *client_hello_outer_local;
  Array<unsigned_char> *out_client_hello_inner_local;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  Span<const_unsigned_char> encoded_client_hello_inner_local;
  
  puVar9 = encoded_client_hello_inner.data_;
  SVar10.size_ = (size_t)puVar9;
  SVar10.data_ = (uchar *)out_client_hello_inner;
  cbs_st::cbs_st((cbs_st *)local_d0,SVar10);
  bVar2 = ssl_parse_client_hello_with_trailing_data
                    ((SSL *)this,(CBS *)local_d0,(SSL_CLIENT_HELLO *)&cbs.len);
  if (!bVar2) {
    return false;
  }
  while (iVar4 = CBS_get_u8((CBS *)local_d0,(uint8_t *)((long)&cbb.ctx_.u + 0x1f)), iVar4 != 0) {
    if (cbb.ctx_.u._31_1_ != '\0') {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x95);
      *(undefined1 *)&ssl->method = 0x2f;
      return false;
    }
  }
  if ((client_hello_inner.extensions == (uint8_t *)0x0) ||
     (client_hello_inner.session_id != (uint8_t *)0x0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x9f);
    return false;
  }
  this_00 = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this_00);
  pcVar1 = *(code **)(*(long *)this + 0x58);
  pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this_00);
  bVar3 = (*pcVar1)(this,pcVar5,(undefined1 *)((long)&extensions_cbb.u + 0x18),1);
  if ((((bVar3 & 1) == 0) ||
      (bVar2 = ssl_client_hello_write_without_extensions
                         ((SSL_CLIENT_HELLO *)&cbs.len,(CBB *)((long)&extensions_cbb.u + 0x18)),
      !bVar2)) ||
     (iVar4 = CBB_add_u16_length_prefixed((CBB *)((long)&extensions_cbb.u + 0x18),(CBB *)local_178),
     iVar4 == 0)) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0xab);
    encoded_client_hello_inner_local.size_._7_1_ = false;
  }
  else {
    Span<const_unsigned_char>::Span
              ((Span<const_unsigned_char> *)&ext_list_wrapper.len,
               (uchar *)client_hello_inner.compression_methods_len,
               (size_t)client_hello_inner.extensions);
    bVar2 = ssl_client_hello_get_extension((SSL_CLIENT_HELLO *)&cbs.len,(CBS *)&offset,0xfd00);
    if (bVar2) {
      puVar8 = CBS_data((CBS *)&offset);
      puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ext_list_wrapper.len);
      SVar10 = Span<const_unsigned_char>::subspan
                         ((Span<const_unsigned_char> *)&ext_list_wrapper.len,0,
                          (size_t)(puVar8 + (-4 - (long)puVar6)));
      inner_extensions_after.size_ = (size_t)SVar10.data_;
      sVar7 = CBS_len((CBS *)&offset);
      SVar10 = Span<const_unsigned_char>::subspan
                         ((Span<const_unsigned_char> *)&ext_list_wrapper.len,
                          (size_t)(puVar8 + (sVar7 - (long)puVar6)),0xffffffffffffffff);
      inner_extensions_after.data_ = (uchar *)SVar10.size_;
      ext_list.len = (size_t)SVar10.data_;
      puVar6 = Span<const_unsigned_char>::data
                         ((Span<const_unsigned_char> *)&inner_extensions_after.size_);
      sVar7 = Span<const_unsigned_char>::size
                        ((Span<const_unsigned_char> *)&inner_extensions_after.size_);
      iVar4 = CBB_add_bytes((CBB *)local_178,puVar6,sVar7);
      if (iVar4 == 0) {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                      ,0xc2);
        encoded_client_hello_inner_local.size_._7_1_ = false;
      }
      else {
        iVar4 = CBS_get_u8_length_prefixed((CBS *)&offset,(CBS *)&outer_extensions.len);
        if (((iVar4 == 0) || (sVar7 = CBS_len((CBS *)&outer_extensions.len), sVar7 == 0)) ||
           (sVar7 = CBS_len((CBS *)&offset), sVar7 != 0)) {
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,0xca);
          encoded_client_hello_inner_local.size_._7_1_ = false;
        }
        else {
          CBS_init((CBS *)local_1f0,*(uint8_t **)(encoded_client_hello_inner.size_ + 0x70),
                   *(size_t *)(encoded_client_hello_inner.size_ + 0x78));
          do {
            sVar7 = CBS_len((CBS *)&outer_extensions.len);
            if (sVar7 == 0) {
              puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ext_list.len);
              sVar7 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ext_list.len);
              iVar4 = CBB_add_bytes((CBB *)local_178,puVar6,sVar7);
              if (iVar4 != 0) goto LAB_0032ce1b;
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,0xf9);
              encoded_client_hello_inner_local.size_._7_1_ = false;
              goto LAB_0032cfac;
            }
            iVar4 = CBS_get_u16((CBS *)&outer_extensions.len,(uint16_t *)((long)&ext_body.len + 6));
            if (iVar4 == 0) {
              ERR_put_error(0x10,0,0x89,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,0xd4);
              encoded_client_hello_inner_local.size_._7_1_ = false;
              goto LAB_0032cfac;
            }
            if (ext_body.len._6_2_ == 0xfe0d) {
              *(undefined1 *)&ssl->method = 0x2f;
              ERR_put_error(0x10,0,0x140,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,0xda);
              encoded_client_hello_inner_local.size_._7_1_ = false;
              goto LAB_0032cfac;
            }
            do {
              sVar7 = CBS_len((CBS *)local_1f0);
              if (sVar7 == 0) {
                *(undefined1 *)&ssl->method = 0x2f;
                ERR_put_error(0x10,0,0x140,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                              ,0xe4);
                encoded_client_hello_inner_local.size_._7_1_ = false;
                goto LAB_0032cfac;
              }
              iVar4 = CBS_get_u16((CBS *)local_1f0,(uint16_t *)((long)&ext_body.len + 4));
              if ((iVar4 == 0) ||
                 (iVar4 = CBS_get_u16_length_prefixed((CBS *)local_1f0,(CBS *)local_208), iVar4 == 0
                 )) {
                ERR_put_error(0x10,0,0x89,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                              ,0xe9);
                encoded_client_hello_inner_local.size_._7_1_ = false;
                goto LAB_0032cfac;
              }
            } while (ext_body.len._4_2_ != ext_body.len._6_2_);
            iVar4 = CBB_add_u16((CBB *)local_178,ext_body.len._4_2_);
            if (iVar4 == 0) break;
            sVar7 = CBS_len((CBS *)local_208);
            iVar4 = CBB_add_u16((CBB *)local_178,(uint16_t)sVar7);
            if (iVar4 == 0) break;
            puVar8 = CBS_data((CBS *)local_208);
            sVar7 = CBS_len((CBS *)local_208);
            iVar4 = CBB_add_bytes((CBB *)local_178,puVar8,sVar7);
          } while (iVar4 != 0);
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,0xf2);
          encoded_client_hello_inner_local.size_._7_1_ = false;
        }
      }
    }
    else {
      puVar6 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ext_list_wrapper.len);
      sVar7 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ext_list_wrapper.len);
      iVar4 = CBB_add_bytes((CBB *)local_178,puVar6,sVar7);
      if (iVar4 == 0) {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                      ,0xb7);
        encoded_client_hello_inner_local.size_._7_1_ = false;
      }
      else {
LAB_0032ce1b:
        iVar4 = CBB_flush((CBB *)((long)&extensions_cbb.u + 0x18));
        if (iVar4 == 0) {
          ERR_put_error(0x10,0,0x44,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,0xfe);
          encoded_client_hello_inner_local.size_._7_1_ = false;
        }
        else {
          puVar8 = CBB_data((CBB *)((long)&extensions_cbb.u + 0x18));
          sVar7 = CBB_len((CBB *)((long)&extensions_cbb.u + 0x18));
          Span<const_unsigned_char>::Span(&local_218,puVar8,sVar7);
          body_00.size_ = (size_t)puVar9;
          body_00.data_ = (uchar *)local_218.size_;
          bVar2 = is_valid_client_hello_inner(this,ssl,local_218.data_,body_00);
          if (bVar2) {
            pcVar1 = *(code **)(*(long *)this + 0x60);
            pcVar5 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&body.u + 0x18));
            bVar3 = (*pcVar1)(this,pcVar5,out_alert);
            if ((bVar3 & 1) == 0) {
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,0x108);
              encoded_client_hello_inner_local.size_._7_1_ = false;
            }
            else {
              encoded_client_hello_inner_local.size_._7_1_ = true;
            }
          }
          else {
            encoded_client_hello_inner_local.size_._7_1_ = false;
          }
        }
      }
    }
  }
LAB_0032cfac:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18));
  return encoded_client_hello_inner_local.size_._7_1_;
}

Assistant:

bool ssl_decode_client_hello_inner(
    SSL *ssl, uint8_t *out_alert, Array<uint8_t> *out_client_hello_inner,
    Span<const uint8_t> encoded_client_hello_inner,
    const SSL_CLIENT_HELLO *client_hello_outer) {
  SSL_CLIENT_HELLO client_hello_inner;
  CBS cbs = encoded_client_hello_inner;
  if (!ssl_parse_client_hello_with_trailing_data(ssl, &cbs,
                                                 &client_hello_inner)) {
    return false;
  }
  // The remaining data is padding.
  uint8_t padding;
  while (CBS_get_u8(&cbs, &padding)) {
    if (padding != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }
  }

  // TLS 1.3 ClientHellos must have extensions, and EncodedClientHelloInners use
  // ClientHelloOuter's session_id.
  if (client_hello_inner.extensions_len == 0 ||
      client_hello_inner.session_id_len != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }
  client_hello_inner.session_id = client_hello_outer->session_id;
  client_hello_inner.session_id_len = client_hello_outer->session_id_len;

  // Begin serializing a message containing the ClientHelloInner in |cbb|.
  ScopedCBB cbb;
  CBB body, extensions_cbb;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_CLIENT_HELLO) ||
      !ssl_client_hello_write_without_extensions(&client_hello_inner, &body) ||
      !CBB_add_u16_length_prefixed(&body, &extensions_cbb)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  auto inner_extensions =
      Span(client_hello_inner.extensions, client_hello_inner.extensions_len);
  CBS ext_list_wrapper;
  if (!ssl_client_hello_get_extension(&client_hello_inner, &ext_list_wrapper,
                                      TLSEXT_TYPE_ech_outer_extensions)) {
    // No ech_outer_extensions. Copy everything.
    if (!CBB_add_bytes(&extensions_cbb, inner_extensions.data(),
                       inner_extensions.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  } else {
    const size_t offset = CBS_data(&ext_list_wrapper) - inner_extensions.data();
    auto inner_extensions_before =
        inner_extensions.subspan(0, offset - 4 /* extension header */);
    auto inner_extensions_after =
        inner_extensions.subspan(offset + CBS_len(&ext_list_wrapper));
    if (!CBB_add_bytes(&extensions_cbb, inner_extensions_before.data(),
                       inner_extensions_before.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }

    // Expand ech_outer_extensions. See draft-ietf-tls-esni-13, Appendix B.
    CBS ext_list;
    if (!CBS_get_u8_length_prefixed(&ext_list_wrapper, &ext_list) ||
        CBS_len(&ext_list) == 0 || CBS_len(&ext_list_wrapper) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    CBS outer_extensions;
    CBS_init(&outer_extensions, client_hello_outer->extensions,
             client_hello_outer->extensions_len);
    while (CBS_len(&ext_list) != 0) {
      // Find the next extension to copy.
      uint16_t want;
      if (!CBS_get_u16(&ext_list, &want)) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        return false;
      }
      // The ECH extension itself is not in the AAD and may not be referenced.
      if (want == TLSEXT_TYPE_encrypted_client_hello) {
        *out_alert = SSL_AD_ILLEGAL_PARAMETER;
        OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_EXTENSION);
        return false;
      }
      // Seek to |want| in |outer_extensions|. |ext_list| is required to match
      // ClientHelloOuter in order.
      uint16_t found;
      CBS ext_body;
      do {
        if (CBS_len(&outer_extensions) == 0) {
          *out_alert = SSL_AD_ILLEGAL_PARAMETER;
          OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_EXTENSION);
          return false;
        }
        if (!CBS_get_u16(&outer_extensions, &found) ||
            !CBS_get_u16_length_prefixed(&outer_extensions, &ext_body)) {
          OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
          return false;
        }
      } while (found != want);
      // Copy the extension.
      if (!CBB_add_u16(&extensions_cbb, found) ||
          !CBB_add_u16(&extensions_cbb, CBS_len(&ext_body)) ||
          !CBB_add_bytes(&extensions_cbb, CBS_data(&ext_body),
                         CBS_len(&ext_body))) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        return false;
      }
    }

    if (!CBB_add_bytes(&extensions_cbb, inner_extensions_after.data(),
                       inner_extensions_after.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }
  if (!CBB_flush(&body)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (!is_valid_client_hello_inner(ssl, out_alert,
                                   Span(CBB_data(&body), CBB_len(&body)))) {
    return false;
  }

  if (!ssl->method->finish_message(ssl, cbb.get(), out_client_hello_inner)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  return true;
}